

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmrandgen.cpp
# Opt level: O1

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  byte bVar1;
  FILE *__s1;
  char *__s;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ui32_t uVar5;
  long lVar6;
  long lVar7;
  string *psVar8;
  FILE *this_00;
  int iVar9;
  
  this->error_flag = true;
  this->format = OF_HEX;
  this->request_size = 0x20;
  this->no_newline_flag = false;
  this->verbose_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->size_provided = false;
  psVar8 = &this->separator;
  (this->separator)._M_dataplus._M_p = (pointer)&(this->separator).field_2;
  this_00 = (FILE *)psVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar8,"-","");
  bVar3 = 1 < argc;
  if (1 < argc) {
    iVar9 = 1;
    do {
      __s1 = (FILE *)argv[iVar9];
      this_00 = __s1;
      iVar4 = strcmp((char *)__s1,"-help");
      if (iVar4 == 0) {
LAB_00110ecb:
        this->help_flag = true;
        goto LAB_00110ecf;
      }
      if ((char)__s1->_flags != '-') {
switchD_00110e96_caseD_6f:
        this_00 = _stderr;
        fprintf(_stderr,"Unrecognized option: %s\n",__s1);
LAB_00110fbc:
        if (bVar3) {
          return;
        }
        break;
      }
      bVar1 = *(byte *)((long)&__s1->_flags + 1);
      this_00 = (FILE *)(ulong)(uint)(int)(char)bVar1;
      iVar4 = isalpha((int)(char)bVar1);
      if ((iVar4 == 0) || (*(char *)((long)&__s1->_flags + 2) != '\0'))
      goto switchD_00110e96_caseD_6f;
      if (bVar1 < 99) {
        if (bVar1 < 0x56) {
          if (bVar1 == 0x42) {
            this->format = OF_BASE64;
          }
          else {
            if (bVar1 != 0x43) goto switchD_00110e96_caseD_6f;
            this->format = OF_CODEWORD;
          }
        }
        else if (bVar1 == 0x56) {
          this->version_flag = true;
        }
        else if (bVar1 == 0x57) {
          iVar9 = iVar9 + 1;
          if ((argc <= iVar9) || (__s = argv[iVar9], *__s == '-')) {
            CommandOptions((CommandOptions *)this_00);
            goto LAB_00110fbc;
          }
          pcVar2 = (char *)(this->separator)._M_string_length;
          strlen(__s);
          this_00 = (FILE *)psVar8;
          std::__cxx11::string::_M_replace((ulong)psVar8,0,pcVar2,(ulong)__s);
        }
        else {
          if (bVar1 != 0x62) goto switchD_00110e96_caseD_6f;
          this->format = OF_BINARY;
        }
        goto LAB_00110ecf;
      }
      switch(bVar1) {
      case 0x6e:
        this->no_newline_flag = true;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
        goto switchD_00110e96_caseD_6f;
      case 0x73:
        iVar9 = iVar9 + 1;
        if ((iVar9 < argc) && (this_00 = (FILE *)argv[iVar9], (char)this_00->_flags != '-')) {
          lVar6 = strtol((char *)this_00,(char **)0x0,10);
          lVar7 = -lVar6;
          if (0 < lVar6) {
            lVar7 = lVar6;
          }
          this->request_size = (ui32_t)lVar7;
          this->size_provided = true;
          break;
        }
        CommandOptions((CommandOptions *)this_00);
        goto LAB_00110fbc;
      case 0x76:
        this->verbose_flag = true;
        break;
      case 0x77:
        this->format = OF_DICTWORD;
        break;
      case 0x78:
        this->format = OF_HEX;
        break;
      default:
        if (bVar1 != 99) {
          if (bVar1 == 0x68) goto LAB_00110ecb;
          goto switchD_00110e96_caseD_6f;
        }
        this->format = OF_CSTRUCT;
      }
LAB_00110ecf:
      iVar9 = iVar9 + 1;
      bVar3 = iVar9 < argc;
    } while (iVar9 < argc);
  }
  if (this->help_flag != false) {
    return;
  }
  if (this->version_flag != false) {
    return;
  }
  if (this->size_provided == false) {
    if (this->format == OF_CODEWORD) {
      uVar5 = 0x14;
    }
    else {
      if (this->format != OF_DICTWORD) goto LAB_00110ffd;
      uVar5 = 0x10;
    }
    this->request_size = uVar5;
  }
  else if (this->request_size == 0) {
    CommandOptions((CommandOptions *)this_00);
    return;
  }
LAB_00110ffd:
  this->error_flag = false;
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), no_newline_flag(false), verbose_flag(false),
    version_flag(false), help_flag(false), format(OF_HEX), request_size(RandBlockSize*2),
    size_provided(false), separator("-")
  {
    for ( int i = 1; i < argc; i++ )
      {

	 if ( (strcmp( argv[i], "-help") == 0) )
	   {
	     help_flag = true;
	     continue;
	   }
     
	if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'b': format = OF_BINARY; break;
	      case 'B': format = OF_BASE64; break;
	      case 'c': format = OF_CSTRUCT; break;
	      case 'C': format = OF_CODEWORD; break;
	      case 'n': no_newline_flag = true; break;
	      case 'h': help_flag = true; break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		request_size = Kumu::xabs(strtol(argv[i], 0, 10));
		size_provided = true;
		break;

	      case 'v': verbose_flag = true; break;
	      case 'V': version_flag = true; break;
	      case 'w': format = OF_DICTWORD; break;

	      case 'W':
		TEST_EXTRA_ARG(i, 'W');
		separator = argv[i];
		break;

	      case 'x': format = OF_HEX; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
	    return;
	  }
      }

    if ( help_flag || version_flag )
      return;

    if ( ! size_provided )
      {
	if ( format == OF_CODEWORD )
	  {
	    request_size = 20;
	  }
	else if ( format == OF_DICTWORD )
	  {
	    request_size = 16;
	  }
      }
    else if ( request_size == 0 )
      {
	fprintf(stderr, "Please use a non-zero request size\n");
	return;
      }

    error_flag = false;
  }